

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O1

void __thiscall RoughConductorBRDF::f(RoughConductorBRDF *this)

{
  vec3f *in_RCX;
  vec3f *in_RDX;
  Color *in_RSI;
  
  f((RoughConductorBRDF *)
    ((long)&(this->super_BRDF)._vptr_BRDF + (long)(this->super_BRDF)._vptr_BRDF[-3]),in_RSI,in_RDX,
    in_RCX);
  return;
}

Assistant:

Color f(const Color& albedo, const vec3f& wo, const vec3f& wi) const override
	{
		vec3f wm = normalized(wo+wi); // microfacet normal
		float cos = dot(wm,wo);
		Color t1 = (eta*eta + k*k) * (cos*cos);
		Color r1 = (t1 - 2*eta*cos + 1) / (t1 + 2*eta*cos + 1);
		Color t2 = eta*eta + k*k;
		Color r2 = (t2 - 2*eta*cos + Color(cos*cos)) / (t2 + 2*eta*cos + Color(cos*cos));
		Color Fres = 0.5 * (r1 + r2); // reflected energy
		return EDX::GGX_D(wm,alpha) * EDX::Smith_G(wo,wi,wm,alpha) / (4 * wo.z * wi.z) * Fres * albedo;
	}